

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O1

void __thiscall QSpanBuffer::addSpan(QSpanBuffer *this,int x,int len,int y,int coverage)

{
  int iVar1;
  
  if (len != 0 && coverage != 0) {
    iVar1 = this->m_spanCount;
    this->m_spans[iVar1].x = x;
    this->m_spans[iVar1].len = len;
    this->m_spans[iVar1].y = y;
    this->m_spans[iVar1].coverage = (uchar)coverage;
    this->m_spanCount = iVar1 + 1;
    if (iVar1 + 1 == 0x100) {
      (*this->m_blend)(0x100,this->m_spans,this->m_data);
      this->m_spanCount = 0;
    }
  }
  return;
}

Assistant:

void addSpan(int x, int len, int y, int coverage)
    {
        if (!coverage || !len)
            return;

        Q_ASSERT(coverage >= 0 && coverage <= 255);
        Q_ASSERT(y >= m_clipRect.top());
        Q_ASSERT(y <= m_clipRect.bottom());
        Q_ASSERT(x >= m_clipRect.left());
        Q_ASSERT(x + int(len) - 1 <= m_clipRect.right());

        m_spans[m_spanCount].x = x;
        m_spans[m_spanCount].len = len;
        m_spans[m_spanCount].y = y;
        m_spans[m_spanCount].coverage = coverage;

        if (++m_spanCount == SPAN_BUFFER_SIZE)
            flushSpans();
    }